

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

string * __thiscall
pbrt::SphericalCamera::ToString_abi_cxx11_(string *__return_storage_ptr__,SphericalCamera *this)

{
  Mapping MVar1;
  char *local_48;
  string local_40;
  
  CameraBase::ToString_abi_cxx11_(&local_40,&this->super_CameraBase);
  MVar1 = this->mapping;
  local_48 = "EqualArea";
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (MVar1 == EquiRectangular) {
    local_48 = "EquiRectangular";
  }
  detail::stringPrintfRecursive<std::__cxx11::string,char_const*>
            (__return_storage_ptr__,"[ SphericalCamera %s mapping: %s ]",&local_40,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SphericalCamera::ToString() const {
    return StringPrintf("[ SphericalCamera %s mapping: %s ]", CameraBase::ToString(),
                        mapping == EquiRectangular ? "EquiRectangular" : "EqualArea");
}